

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int CTcParser::read_len_prefix_str(CVmFile *fp,char *buf,size_t buf_len,int err_if_too_long)

{
  bool bVar1;
  uint uVar2;
  ulong buflen;
  uint in_ECX;
  CVmFile *in_RDX;
  long in_RSI;
  size_t alloc_len;
  size_t read_len;
  CVmFile *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  uVar2 = CVmFile::read_uint2(in_stack_ffffffffffffffd0);
  buflen = (ulong)uVar2;
  bVar1 = (CVmFile *)(buflen + 1) <= in_RDX;
  if (bVar1) {
    CVmFile::read_bytes(in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),buflen);
    *(undefined1 *)(in_RSI + buflen) = 0;
  }
  else {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,(int)(ulong)in_ECX);
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int CTcParser::read_len_prefix_str(CVmFile *fp, char *buf, size_t buf_len,
                                   int err_if_too_long)
{
    size_t read_len;
    size_t alloc_len;

    /* read the length to read from the file */
    read_len = (size_t)fp->read_uint2();

    /* add a byte for null termination */
    alloc_len = read_len + 1;

    /* if it won't fit in the temporary buffer, it's an error */
    if (alloc_len > buf_len)
    {
        /* log the error and return failure */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, err_if_too_long);
        return 1;
    }

    /* read the bytes into the caller's buffer */
    fp->read_bytes(buf, read_len);

    /* add null termination */
    buf[read_len] = '\0';

    /* success */
    return 0;
}